

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

void __thiscall
capnp::BufferedMessageStream::BufferedMessageStream
          (BufferedMessageStream *this,AsyncCapabilityStream *stream,
          IsShortLivedCallback *isShortLivedCallback,size_t bufferSizeInWords)

{
  Function<bool_(capnp::MessageReader_&)> *pFVar1;
  word *pwVar2;
  uchar *puVar3;
  ArrayPtr<unsigned_char> local_48 [2];
  size_t local_28;
  size_t bufferSizeInWords_local;
  IsShortLivedCallback *isShortLivedCallback_local;
  AsyncCapabilityStream *stream_local;
  BufferedMessageStream *this_local;
  
  local_28 = bufferSizeInWords;
  bufferSizeInWords_local = (size_t)isShortLivedCallback;
  isShortLivedCallback_local = (IsShortLivedCallback *)stream;
  stream_local = (AsyncCapabilityStream *)this;
  MessageStream::MessageStream(&this->super_MessageStream);
  (this->super_MessageStream)._vptr_MessageStream = (_func_int **)&PTR_tryReadMessage_00d88a00;
  this->stream = (AsyncIoStream *)isShortLivedCallback_local;
  kj::Maybe<kj::AsyncCapabilityStream_&>::Maybe
            (&this->capStream,(AsyncCapabilityStream *)isShortLivedCallback_local);
  pFVar1 = kj::mv<kj::Function<bool(capnp::MessageReader&)>>(isShortLivedCallback);
  kj::Function<bool_(capnp::MessageReader_&)>::Function(&this->isShortLivedCallback,pFVar1);
  kj::heapArray<capnp::word>(&this->buffer,local_28);
  pwVar2 = kj::Array<capnp::word>::begin(&this->buffer);
  this->beginData = pwVar2;
  local_48[0] = kj::Array<capnp::word>::asBytes(&this->buffer);
  puVar3 = kj::ArrayPtr<unsigned_char>::begin(local_48);
  this->beginAvailable = puVar3;
  kj::Vector<kj::OwnFd>::Vector(&this->leftoverFds);
  this->hasOutstandingShortLivedMessage = false;
  return;
}

Assistant:

BufferedMessageStream::BufferedMessageStream(
    kj::AsyncCapabilityStream& stream, IsShortLivedCallback isShortLivedCallback,
    size_t bufferSizeInWords)
    : stream(stream), capStream(stream), isShortLivedCallback(kj::mv(isShortLivedCallback)),
      buffer(kj::heapArray<word>(bufferSizeInWords)),
      beginData(buffer.begin()), beginAvailable(buffer.asBytes().begin()) {}